

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

opcode_table * assembler::anon_unknown_0::make_push_table(void)

{
  opcode_table *in_RDI;
  allocator<char> local_79;
  string local_78;
  opcode local_58;
  undefined1 local_11;
  opcode_table *t;
  
  local_11 = 0;
  opcode_table::opcode_table(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"PUSH",&local_79);
  make_opcode(&local_58,&local_78,0x10000,'P',rm64,none);
  opcode_table::add_opcode(in_RDI,&local_58);
  opcode::~opcode(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return in_RDI;
}

Assistant:

opcode_table make_push_table()
    {
    opcode_table t;
    t.add_opcode(make_opcode("PUSH", opcode::rd, 0x50, opcode::rm64, opcode::none));
    //t.add_opcode(make_opcode("PUSH", opcode::digit6, 0xff, opcode::m64, opcode::none));
    return t;
    }